

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,int initialSize,void *item)

{
  int iVar1;
  void *item_local;
  int initialSize_local;
  xmlSchemaItemListPtr list_local;
  
  if ((list->nbItems < list->sizeItems) ||
     (iVar1 = xmlSchemaItemListGrow(list,initialSize), -1 < iVar1)) {
    iVar1 = list->nbItems;
    list->nbItems = iVar1 + 1;
    list->items[iVar1] = item;
    list_local._4_4_ = 0;
  }
  else {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
    list_local._4_4_ = -1;
  }
  return list_local._4_4_;
}

Assistant:

static int
xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,
			 int initialSize,
			 void *item)
{
    if (list->sizeItems <= list->nbItems) {
        if (xmlSchemaItemListGrow(list, initialSize) < 0) {
	    xmlSchemaPErrMemory(NULL);
	    return(-1);
        }
    }

    list->items[list->nbItems++] = item;
    return(0);
}